

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O2

uint8_t * pvpatch(uint8_t *p,uint32_t size,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint8_t *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  uint8_t local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list arg;
  
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if (in_AL != '\0') {
    uStack_88 = in_XMM0_Qa;
    arg[0].overflow_arg_area = in_XMM1_Qa;
  }
  puVar2 = &stack0x00000008;
  uVar1 = 0x10;
  while (bVar5 = size != 0, size = size - 1, bVar5) {
    if (uVar1 < 0x29) {
      uVar3 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      puVar4 = local_b8 + uVar3;
    }
    else {
      puVar4 = puVar2;
      puVar2 = puVar2 + 8;
    }
    *p = *puVar4;
    p = p + 1;
  }
  return p;
}

Assistant:

uint8_t *pvpatch(uint8_t *p, const uint32_t size, ...)
{
    uint32_t i;
    va_list arg;

    va_start(arg, size);

    for (i=0; i < size; i++) {
        *(p++) = va_arg(arg, int);
    }
    va_end(arg);
    return p;

}